

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint32_t helper_mvst(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  ulong uVar1;
  uint8_t byte;
  int iVar2;
  uint64_t vaddr;
  uint64_t vaddr_00;
  int size;
  ulong uVar3;
  long lVar4;
  uintptr_t unaff_retaddr;
  uint8_t local_88;
  S390Access local_80;
  S390Access local_58;
  
  iVar2 = cpu_mmu_index(env,SUB41(r1,0));
  vaddr = get_address(env,r1);
  vaddr_00 = get_address(env,r2);
  uVar1 = env->regs[0];
  uVar3 = -(vaddr_00 | 0xfffffffffffff000);
  if (-(vaddr | 0xfffffffffffff000) < -(vaddr_00 | 0xfffffffffffff000)) {
    uVar3 = -(vaddr | 0xfffffffffffff000);
  }
  if ((uVar1 & 0xffffff00) == 0) {
    lVar4 = 0;
    size = (int)uVar3;
    access_prepare(&local_58,env,vaddr_00,size,MMU_DATA_LOAD,iVar2,unaff_retaddr);
    access_prepare(&local_80,env,vaddr,size,MMU_DATA_STORE,iVar2,unaff_retaddr);
    while( true ) {
      iVar2 = (int)lVar4;
      if (size == iVar2) {
        set_address_zero(env,r1,vaddr + uVar3);
        set_address_zero(env,r2,vaddr_00 + uVar3);
        return 3;
      }
      byte = access_get_byte(env,&local_58,iVar2,unaff_retaddr);
      access_set_byte(env,&local_80,iVar2,byte,unaff_retaddr);
      local_88 = (uint8_t)uVar1;
      if (byte == local_88) break;
      lVar4 = lVar4 + 1;
    }
    set_address_zero(env,r1,vaddr + lVar4);
    return 1;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

uint32_t HELPER(mvst)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    const uint64_t d = get_address(env, r1);
    const uint64_t s = get_address(env, r2);
    const uint8_t c = env->regs[0];
    const int len = MIN(-(d | TARGET_PAGE_MASK), -(s | TARGET_PAGE_MASK));
    S390Access srca, desta;
    uintptr_t ra = GETPC();
    int i;

    if (env->regs[0] & 0xffffff00ull) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    /*
     * Our access should not exceed single pages, as we must not report access
     * exceptions exceeding the actually copied range (which we don't know at
     * this point). We might over-indicate watchpoints within the pages
     * (if we ever care, we have to limit processing to a single byte).
     */
    srca = access_prepare(env, s, len, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, d, len, MMU_DATA_STORE, mmu_idx, ra);
    for (i = 0; i < len; i++) {
        const uint8_t v = access_get_byte(env, &srca, i, ra);

        access_set_byte(env, &desta, i, v, ra);
        if (v == c) {
            set_address_zero(env, r1, d + i);
            return 1;
        }
    }
    set_address_zero(env, r1, d + len);
    set_address_zero(env, r2, s + len);
    return 3;
}